

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall t_cpp_generator::close_generator(t_cpp_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  string *psVar1;
  ofstream_with_content_based_conditional_update *this_01;
  ostream *poVar2;
  int __fd;
  string f_types_impl_name;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->f_types_;
  psVar1 = &this->ns_close_;
  poVar2 = std::operator<<((ostream *)this_00,(string *)psVar1);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)&this->f_types_impl_,(string *)psVar1);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  this_01 = &this->f_types_tcc_;
  poVar2 = std::operator<<((ostream *)this_01,(string *)psVar1);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  if (this->gen_templates_ == true) {
    poVar2 = std::operator<<((ostream *)this_00,"#include \"");
    get_include_prefix_abi_cxx11_
              (&local_90,this,(this->super_t_oop_generator).super_t_generator.program_);
    poVar2 = std::operator<<(poVar2,(string *)&local_90);
    poVar2 = std::operator<<(poVar2,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar2 = std::operator<<(poVar2,"_types.tcc\"");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_90);
  }
  poVar2 = std::operator<<((ostream *)this_00,"#endif");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)this_01,"#endif");
  __fd = 0x36bba0;
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_types_impl_,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_01,__fd);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_50,this);
  std::operator+(&local_70,&local_50,&(this->super_t_oop_generator).super_t_generator.program_name_)
  ;
  std::operator+(&local_90,&local_70,"_types.cpp");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->has_members_ == false) {
    remove(local_90._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void t_cpp_generator::close_generator() {
  // Close namespace
  f_types_ << ns_close_ << endl << endl;
  f_types_impl_ << ns_close_ << endl;
  f_types_tcc_ << ns_close_ << endl << endl;

  // Include the types.tcc file from the types header file,
  // so clients don't have to explicitly include the tcc file.
  // TODO(simpkins): Make this a separate option.
  if (gen_templates_) {
    f_types_ << "#include \"" << get_include_prefix(*get_program()) << program_name_
             << "_types.tcc\"" << endl << endl;
  }

  // Close ifndef
  f_types_ << "#endif" << endl;
  f_types_tcc_ << "#endif" << endl;

  // Close output file
  f_types_.close();
  f_types_impl_.close();
  f_types_tcc_.close();

  string f_types_impl_name = get_out_dir() + program_name_ + "_types.cpp";

  if (!has_members_) {
    remove(f_types_impl_name.c_str());
  }
}